

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

void nk_draw_list_path_stroke
               (nk_draw_list *list,nk_color color,nk_draw_list_stroke closed,float thickness)

{
  if (list == (nk_draw_list *)0x0) {
    __assert_fail("list",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x2205,
                  "void nk_draw_list_path_stroke(struct nk_draw_list *, struct nk_color, enum nk_draw_list_stroke, float)"
                 );
  }
  if (list->buffer != (nk_buffer *)0x0) {
    nk_draw_list_stroke_poly_line
              (list,(nk_vec2 *)(list->buffer->memory).ptr,list->path_count,color,closed,thickness,
               (list->config).line_AA);
    nk_buffer_reset(list->buffer,NK_BUFFER_FRONT);
    list->path_count = 0;
    list->path_offset = 0;
    return;
  }
  __assert_fail("buffer",
                "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                ,0x1a63,"void *nk_buffer_memory(struct nk_buffer *)");
}

Assistant:

NK_API void
nk_draw_list_path_stroke(struct nk_draw_list *list, struct nk_color color,
    enum nk_draw_list_stroke closed, float thickness)
{
    struct nk_vec2 *points;
    NK_ASSERT(list);
    if (!list) return;
    points = (struct nk_vec2*)nk_buffer_memory(list->buffer);
    nk_draw_list_stroke_poly_line(list, points, list->path_count, color,
        closed, thickness, list->config.line_AA);
    nk_draw_list_path_clear(list);
}